

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

int perform_getsock(Curl_easy *data,curl_socket_t *sock)

{
  connectdata *pcVar1;
  _func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *UNRECOVERED_JUMPTABLE;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  
  pcVar1 = data->conn;
  if (pcVar1 == (connectdata *)0x0) {
    return 0;
  }
  UNRECOVERED_JUMPTABLE = pcVar1->handler->perform_getsock;
  if (UNRECOVERED_JUMPTABLE != (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0) {
    iVar2 = (*UNRECOVERED_JUMPTABLE)(data,pcVar1,sock);
    return iVar2;
  }
  uVar6 = (data->req).keepon;
  uVar4 = uVar6 & 0x15;
  if (uVar4 == 1) {
    *sock = pcVar1->sockfd;
    uVar6 = (data->req).keepon;
  }
  uVar3 = (uint)(uVar4 == 1);
  if ((uVar6 & 0x2a) == 2) {
    if ((uVar4 == 1) && (pcVar1->sockfd == pcVar1->writesockfd)) {
      bVar5 = 0x10;
    }
    else {
      sock[uVar4 == 1] = pcVar1->writesockfd;
      bVar5 = uVar4 == 1 | 0x10;
    }
    uVar3 = uVar3 | 1 << bVar5;
  }
  return uVar3;
}

Assistant:

static int perform_getsock(struct Curl_easy *data, curl_socket_t *sock)
{
  struct connectdata *conn = data->conn;

  if(!conn)
    return GETSOCK_BLANK;
  else if(conn->handler->perform_getsock)
    return conn->handler->perform_getsock(data, conn, sock);
  else {
    /* Default is to obey the data->req.keepon flags for send/recv */
    int bitmap = GETSOCK_BLANK;
    unsigned sockindex = 0;
    if(CURL_WANT_RECV(data)) {
      DEBUGASSERT(conn->sockfd != CURL_SOCKET_BAD);
      bitmap |= GETSOCK_READSOCK(sockindex);
      sock[sockindex] = conn->sockfd;
    }

    if(CURL_WANT_SEND(data)) {
      if((conn->sockfd != conn->writesockfd) ||
         bitmap == GETSOCK_BLANK) {
        /* only if they are not the same socket and we have a readable
           one, we increase index */
        if(bitmap != GETSOCK_BLANK)
          sockindex++; /* increase index if we need two entries */

        DEBUGASSERT(conn->writesockfd != CURL_SOCKET_BAD);
        sock[sockindex] = conn->writesockfd;
      }
      bitmap |= GETSOCK_WRITESOCK(sockindex);
    }
    return bitmap;
  }
}